

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::
FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::FieldGeneratorMap
          (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this,
          Descriptor *descriptor,Context *context)

{
  FieldDescriptor *field;
  ulong __n;
  long lVar1;
  long lVar2;
  RepeatedImmutableEnumFieldGenerator *pRVar3;
  JavaType JVar4;
  int iVar5;
  int iVar6;
  long *plVar7;
  Descriptor *pDVar8;
  RepeatedImmutableEnumFieldGenerator *this_00;
  scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator> *psVar9;
  int iVar10;
  ulong uVar11;
  int messageBitIndex;
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
  *this_01;
  long lVar12;
  long lVar13;
  
  this->descriptor_ = descriptor;
  this_01 = &this->field_generators_;
  iVar10 = *(int *)(descriptor + 0x2c);
  lVar12 = (long)iVar10;
  __n = lVar12 * 8;
  uVar11 = __n + 8;
  if (0xfffffffffffffff7 < __n) {
    uVar11 = 0xffffffffffffffff;
  }
  if (lVar12 < 0) {
    uVar11 = 0xffffffffffffffff;
  }
  plVar7 = (long *)operator_new__(uVar11);
  psVar9 = (scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator> *)(plVar7 + 1);
  *plVar7 = lVar12;
  if (lVar12 == 0) {
    this_01->array_ = psVar9;
  }
  else {
    messageBitIndex = 0;
    memset(psVar9,0,__n);
    this_01->array_ = psVar9;
    if (0 < iVar10) {
      lVar13 = 0;
      lVar12 = 0;
      iVar10 = 0;
      do {
        lVar1 = *(long *)(descriptor + 0x30);
        field = (FieldDescriptor *)(lVar1 + lVar13);
        if (*(int *)(lVar1 + 0x4c + lVar13) == 3) {
          JVar4 = GetJavaType(field);
          if (JVar4 == JAVATYPE_STRING) {
            this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
            RepeatedImmutableStringFieldGenerator::RepeatedImmutableStringFieldGenerator
                      ((RepeatedImmutableStringFieldGenerator *)this_00,field,messageBitIndex,iVar10
                       ,context);
          }
          else if (JVar4 == JAVATYPE_ENUM) {
            this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
            RepeatedImmutableEnumFieldGenerator::RepeatedImmutableEnumFieldGenerator
                      (this_00,field,messageBitIndex,iVar10,context);
          }
          else if (JVar4 == JAVATYPE_MESSAGE) {
            pDVar8 = FieldDescriptor::message_type(field);
            if (*(char *)(*(long *)(pDVar8 + 0x20) + 0x6b) == '\x01') {
              this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x48);
              ImmutableMapFieldGenerator::ImmutableMapFieldGenerator
                        ((ImmutableMapFieldGenerator *)this_00,field,messageBitIndex,iVar10,context)
              ;
            }
            else if ((((context->options_).enforce_lite == false) &&
                     (*(int *)(*(long *)(*(long *)(lVar1 + 0x30 + lVar13) + 0xa0) + 0xa8) != 3)) ||
                    (*(char *)(*(long *)(lVar1 + 0x80 + lVar13) + 0x6d) != '\x01')) {
              this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
              RepeatedImmutableMessageFieldGenerator::RepeatedImmutableMessageFieldGenerator
                        ((RepeatedImmutableMessageFieldGenerator *)this_00,field,messageBitIndex,
                         iVar10,context);
            }
            else {
              this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
              RepeatedImmutableLazyMessageFieldGenerator::RepeatedImmutableLazyMessageFieldGenerator
                        ((RepeatedImmutableLazyMessageFieldGenerator *)this_00,field,messageBitIndex
                         ,iVar10,context);
            }
          }
          else {
            this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
            RepeatedImmutablePrimitiveFieldGenerator::RepeatedImmutablePrimitiveFieldGenerator
                      ((RepeatedImmutablePrimitiveFieldGenerator *)this_00,field,messageBitIndex,
                       iVar10,context);
          }
        }
        else {
          lVar2 = *(long *)(lVar1 + 0x60 + lVar13);
          JVar4 = GetJavaType(field);
          if (lVar2 == 0) {
            if (JVar4 == JAVATYPE_STRING) {
              this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
              ImmutableStringFieldGenerator::ImmutableStringFieldGenerator
                        ((ImmutableStringFieldGenerator *)this_00,field,messageBitIndex,iVar10,
                         context);
            }
            else if (JVar4 == JAVATYPE_ENUM) {
              this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
              ImmutableEnumFieldGenerator::ImmutableEnumFieldGenerator
                        ((ImmutableEnumFieldGenerator *)this_00,field,messageBitIndex,iVar10,context
                        );
            }
            else if (JVar4 == JAVATYPE_MESSAGE) {
              if ((((context->options_).enforce_lite == false) &&
                  (*(int *)(*(long *)(*(long *)(lVar1 + 0x30 + lVar13) + 0xa0) + 0xa8) != 3)) ||
                 (*(char *)(*(long *)(lVar1 + 0x80 + lVar13) + 0x6d) != '\x01')) {
                this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
                ImmutableMessageFieldGenerator::ImmutableMessageFieldGenerator
                          ((ImmutableMessageFieldGenerator *)this_00,field,messageBitIndex,iVar10,
                           context);
              }
              else {
                this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
                ImmutableLazyMessageFieldGenerator::ImmutableLazyMessageFieldGenerator
                          ((ImmutableLazyMessageFieldGenerator *)this_00,field,messageBitIndex,
                           iVar10,context);
              }
            }
            else {
              this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
              ImmutablePrimitiveFieldGenerator::ImmutablePrimitiveFieldGenerator
                        ((ImmutablePrimitiveFieldGenerator *)this_00,field,messageBitIndex,iVar10,
                         context);
            }
          }
          else if (JVar4 == JAVATYPE_STRING) {
            this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
            ImmutableStringOneofFieldGenerator::ImmutableStringOneofFieldGenerator
                      ((ImmutableStringOneofFieldGenerator *)this_00,field,messageBitIndex,iVar10,
                       context);
          }
          else if (JVar4 == JAVATYPE_ENUM) {
            this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
            ImmutableEnumOneofFieldGenerator::ImmutableEnumOneofFieldGenerator
                      ((ImmutableEnumOneofFieldGenerator *)this_00,field,messageBitIndex,iVar10,
                       context);
          }
          else if (JVar4 == JAVATYPE_MESSAGE) {
            if ((((context->options_).enforce_lite == false) &&
                (*(int *)(*(long *)(*(long *)(lVar1 + 0x30 + lVar13) + 0xa0) + 0xa8) != 3)) ||
               (*(char *)(*(long *)(lVar1 + 0x80 + lVar13) + 0x6d) != '\x01')) {
              this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
              ImmutableMessageOneofFieldGenerator::ImmutableMessageOneofFieldGenerator
                        ((ImmutableMessageOneofFieldGenerator *)this_00,field,messageBitIndex,iVar10
                         ,context);
            }
            else {
              this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
              ImmutableLazyMessageOneofFieldGenerator::ImmutableLazyMessageOneofFieldGenerator
                        ((ImmutableLazyMessageOneofFieldGenerator *)this_00,field,messageBitIndex,
                         iVar10,context);
            }
          }
          else {
            this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
            ImmutablePrimitiveOneofFieldGenerator::ImmutablePrimitiveOneofFieldGenerator
                      ((ImmutablePrimitiveOneofFieldGenerator *)this_00,field,messageBitIndex,iVar10
                       ,context);
          }
        }
        psVar9 = internal::
                 scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                 ::operator[](this_01,lVar12);
        pRVar3 = (RepeatedImmutableEnumFieldGenerator *)psVar9->ptr_;
        if (pRVar3 != this_00) {
          if (pRVar3 != (RepeatedImmutableEnumFieldGenerator *)0x0) {
            (*(pRVar3->super_ImmutableFieldGenerator)._vptr_ImmutableFieldGenerator[1])();
          }
          psVar9->ptr_ = &this_00->super_ImmutableFieldGenerator;
        }
        iVar5 = (*(this_00->super_ImmutableFieldGenerator)._vptr_ImmutableFieldGenerator[2])
                          (this_00);
        iVar6 = (*(this_00->super_ImmutableFieldGenerator)._vptr_ImmutableFieldGenerator[3])
                          (this_00);
        messageBitIndex = messageBitIndex + iVar5;
        iVar10 = iVar10 + iVar6;
        lVar12 = lVar12 + 1;
        lVar13 = lVar13 + 0xa8;
      } while (lVar12 < *(int *)(descriptor + 0x2c));
    }
  }
  return;
}

Assistant:

FieldGeneratorMap<ImmutableFieldGenerator>::FieldGeneratorMap(
    const Descriptor* descriptor, Context* context)
    : descriptor_(descriptor),
      field_generators_(new google::protobuf::scoped_ptr<
          ImmutableFieldGenerator>[descriptor->field_count()]) {

  // Construct all the FieldGenerators and assign them bit indices for their
  // bit fields.
  int messageBitIndex = 0;
  int builderBitIndex = 0;
  for (int i = 0; i < descriptor->field_count(); i++) {
    ImmutableFieldGenerator* generator = MakeImmutableGenerator(
        descriptor->field(i), messageBitIndex, builderBitIndex, context);
    field_generators_[i].reset(generator);
    messageBitIndex += generator->GetNumBitsForMessage();
    builderBitIndex += generator->GetNumBitsForBuilder();
  }
}